

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::get_hash_for_compute_pipeline_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false> local_30;
  iterator itr;
  Hash *hash_local;
  VkPipeline pipeline_local;
  StateRecorder *this_local;
  
  itr.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>)hash;
  hash_local = (Hash *)pipeline;
  pipeline_local = (VkPipeline)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<VkPipeline_T_*,_unsigned_long,_std::hash<VkPipeline_T_*>,_std::equal_to<VkPipeline_T_*>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>_>
       ::find(&this->impl->compute_pipeline_to_hash,(key_type *)&hash_local);
  local_38._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<VkPipeline_T*,unsigned_long,std::hash<VkPipeline_T*>,std::equal_to<VkPipeline_T*>,std::allocator<std::pair<VkPipeline_T*const,unsigned_long>>>>
                 (&this->impl->compute_pipeline_to_hash);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    log_failed_hash<VkPipeline_T*>("Compute pipeline",(VkPipeline_T *)hash_local);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<VkPipeline_T_*const,_unsigned_long>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<VkPipeline_T_*const,_unsigned_long>,_false,_false>
                         *)&local_30);
    *(unsigned_long *)
     itr.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur =
         ppVar2->second;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::get_hash_for_compute_pipeline_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->compute_pipeline_to_hash.find(pipeline);
	if (itr == end(impl->compute_pipeline_to_hash))
	{
		log_failed_hash("Compute pipeline", pipeline);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}